

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

PackedStructNode * __thiscall
kratos::PackedStructGraph::get_node(PackedStructGraph *this,PackedStruct *value)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_true>
  local_28;
  PackedStruct *local_20;
  PackedStruct *value_local;
  PackedStructGraph *this_local;
  
  if (value == (PackedStruct *)0x0) {
    this_local = (PackedStructGraph *)0x0;
  }
  else {
    local_20 = value;
    value_local = (PackedStruct *)this;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
         ::find(&this->nodes_,&value->struct_name);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
         ::end(&this->nodes_);
    bVar1 = std::__detail::operator==(&local_28,&local_30);
    if (bVar1) {
      add_node(this,local_20);
    }
    this_local = (PackedStructGraph *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
                 ::at(&this->nodes_,&local_20->struct_name);
  }
  return (PackedStructNode *)this_local;
}

Assistant:

PackedStructNode *PackedStructGraph::get_node(const PackedStruct *value) {
    if (!value) return nullptr;
    if (nodes_.find(value->struct_name) == nodes_.end()) {
        add_node(value);
    }
    return &nodes_.at(value->struct_name);
}